

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexSubImageCubeBufferCase::createTexture(TexSubImageCubeBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deUint32 seed;
  int iVar6;
  TransferFormat TVar7;
  int i_1;
  int iVar8;
  int face;
  long lVar9;
  uint rowPitch;
  int ndx;
  long lVar10;
  float fVar11;
  deUint32 buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  Vec4 gMin;
  Vec4 gMax;
  Vec4 colorB;
  Vector<float,_4> res_3;
  Vec4 colorA;
  float local_50 [4];
  Random rnd;
  
  seed = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                      super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  this_01 = &(this->super_TextureCubeSpecCase).m_texFormat;
  TVar7 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  iVar6 = tcu::TextureFormat::getPixelSize(this_01);
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  iVar8 = (this->super_TextureCubeSpecCase).m_size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((iVar8 * iVar6 + 3U & 0xfffffffc) * iVar8));
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  lVar9 = 0;
  do {
    gMin.m_data[0] = 0.0;
    gMin.m_data[1] = 0.0;
    gMin.m_data[2] = 0.0;
    gMin.m_data[3] = 0.0;
    lVar10 = 0;
    do {
      fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
      fVar11 = deRandom_getFloat(&rnd.m_rnd);
      gMin.m_data[lVar10] = (fVar2 - fVar1) * fVar11 + fVar1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    gMax.m_data[0] = 0.0;
    gMax.m_data[1] = 0.0;
    gMax.m_data[2] = 0.0;
    gMax.m_data[3] = 0.0;
    lVar10 = 0;
    do {
      fVar1 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar10];
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar10];
      fVar11 = deRandom_getFloat(&rnd.m_rnd);
      gMax.m_data[lVar10] = (fVar2 - fVar1) * fVar11 + fVar1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    iVar8 = (this->super_TextureCubeSpecCase).m_size;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res_3,this_01,iVar8,iVar8,1,iVar8 * iVar6 + 3U & 0xfffffffc,0,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::fillWithComponentGradients((PixelBufferAccess *)&res_3,&gMin,&gMax);
    iVar8 = (this->super_TextureCubeSpecCase).m_size;
    sglr::ContextWrapper::glTexImage2D
              (this_00,(&s_cubeMapFaces)[lVar9],0,this->m_internalFormat,iVar8,iVar8,0,TVar7.format,
               TVar7.dataType,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  iVar8 = this->m_rowLength;
  if (iVar8 < 1) {
    iVar8 = this->m_subW;
  }
  iVar3 = this->m_subH;
  iVar4 = this->m_alignment;
  iVar5 = this->m_skipRows;
  gMin.m_data[0] = 0.0;
  gMin.m_data[1] = 0.0;
  gMin.m_data[2] = 0.0;
  gMin.m_data[3] = 0.0;
  lVar9 = 0;
  do {
    gMin.m_data[lVar9] =
         (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar9] -
         (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  rowPitch = iVar4 + -1 + iVar8 * iVar6 & -iVar4;
  gMax.m_data._0_8_ =
       *(undefined8 *)(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data;
  gMax.m_data._8_8_ =
       *(undefined8 *)((this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data + 2);
  colorB.m_data[0] = 1.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 1.0;
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  res_3.m_data[2] = 0.0;
  res_3.m_data[3] = 0.0;
  lVar9 = 0;
  do {
    res_3.m_data[lVar9] = colorB.m_data[lVar9] * gMin.m_data[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  colorA.m_data[0] = 0.0;
  colorA.m_data[1] = 0.0;
  colorA.m_data[2] = 0.0;
  colorA.m_data[3] = 0.0;
  lVar9 = 0;
  do {
    colorA.m_data[lVar9] = res_3.m_data[lVar9] + gMax.m_data[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  local_50[0] = 0.0;
  local_50[1] = 1.0;
  local_50[2] = 0.0;
  local_50[3] = 1.0;
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  res_3.m_data[2] = 0.0;
  res_3.m_data[3] = 0.0;
  lVar9 = 0;
  do {
    res_3.m_data[lVar9] = local_50[lVar9] * gMin.m_data[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  colorB.m_data[0] = 0.0;
  colorB.m_data[1] = 0.0;
  colorB.m_data[2] = 0.0;
  colorB.m_data[3] = 0.0;
  lVar9 = 0;
  do {
    colorB.m_data[lVar9] = res_3.m_data[lVar9] + gMax.m_data[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((iVar5 + iVar3) * rowPitch + this->m_offset));
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res_3,this_01,this->m_subW,this->m_subH,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset + (long)(this->m_skipPixels * iVar6) +
             (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid((PixelBufferAccess *)&res_3,4,&colorA,&colorB);
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  lVar9 = 0;
  do {
    sglr::ContextWrapper::glTexSubImage2D
              (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar9),0,this->m_subX,this->m_subY,
               this->m_subW,this->m_subH,TVar7.format,TVar7.dataType,(void *)(long)this->m_offset);
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x18);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		de::Random				rnd				(deStringHash(getName()));
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		// Fill faces with different gradients.

		data.resize(deAlign32(m_size*pixelSize, 4)*m_size);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
		{
			const Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			const Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, deAlign32(m_size*pixelSize, 4), 0, &data[0]), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, transferFmt.format, transferFmt.dataType, &data[0]);
		}

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexSubImage2D(s_cubeMapFaces[face], 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}